

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_visuals.cxx
# Opt level: O1

void __thiscall xray_re::xr_visual_object::save_v12(xr_visual_object *this,xr_ini_writer *w)

{
  pointer pcVar1;
  size_t __n;
  long *local_38 [2];
  long local_28 [2];
  
  xr_custom_object::save_v12(&this->super_xr_custom_object,w);
  pcVar1 = (this->m_reference)._M_dataplus._M_p;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,pcVar1,pcVar1 + (this->m_reference)._M_string_length);
  __n = 0;
  xr_ini_writer::write(w,0x1f2beb,local_38,0);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  xr_ini_writer::write(w,0x1f3d25,(void *)0x12,__n);
  return;
}

Assistant:

void xr_visual_object::save_v12(xr_ini_writer* w) const
{
	xr_custom_object::save_v12(w);

	w->write("reference_name", m_reference, false);
	w->write("version", SCENEOBJ_VERSION_18);
}